

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_add_between_face_interior
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL node1_weight,REF_INT new_node)

{
  uint uVar1;
  REF_STATUS RVar2;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  double local_238;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_DBL temp_xyz [3];
  double local_1f8;
  REF_DBL temp_uv [2];
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_BOOL verbose;
  REF_DBL last_error;
  REF_DBL relax;
  REF_DBL error;
  REF_DBL actual;
  REF_DBL weight;
  REF_DBL r1;
  REF_DBL r0;
  REF_INT nodes3 [27];
  REF_INT nodes2 [27];
  REF_INT local_94;
  REF_INT cells [2];
  REF_INT ncell;
  REF_INT sense;
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  REF_DBL uv [2];
  REF_INT local_50;
  REF_INT local_4c;
  REF_INT id;
  REF_INT type;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_DBL RStack_28;
  REF_INT new_node_local;
  REF_DBL node1_weight_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_geom = (REF_GEOM)ref_grid->node;
  ref_cell = (REF_CELL)ref_grid->geom;
  _id = ref_grid->cell[3];
  local_4c = 2;
  ref_node._4_4_ = new_node;
  RStack_28 = node1_weight;
  node1_weight_local._0_4_ = node1;
  node1_weight_local._4_4_ = node0;
  _node1_local = ref_grid;
  uVar1 = ref_geom_unique_id((REF_GEOM)ref_cell,new_node,2,&local_50);
  if (uVar1 == 0) {
    uVar1 = ref_cell_list_with2(_id,node1_weight_local._4_4_,node1_weight_local._0_4_,2,cells,
                                nodes2 + 0x1a);
    if (uVar1 == 0) {
      if ((long)cells[0] == 2) {
        uVar1 = ref_cell_nodes(_id,nodes2[0x1a],nodes3 + 0x1a);
        if (uVar1 == 0) {
          uVar1 = ref_cell_nodes(_id,local_94,(REF_INT *)&r0);
          if (uVar1 == 0) {
            uVar1 = ref_geom_cell_tuv((REF_GEOM)ref_cell,node1_weight_local._4_4_,nodes3 + 0x1a,
                                      local_4c,uv1 + 1,cells + 1);
            if (uVar1 == 0) {
              uVar1 = ref_geom_cell_tuv((REF_GEOM)ref_cell,node1_weight_local._0_4_,nodes3 + 0x1a,
                                        local_4c,(REF_DBL *)&ncell,cells + 1);
              if (uVar1 == 0) {
                local_1f8 = (1.0 - RStack_28) * uv1[1] + RStack_28 * _ncell;
                temp_uv[0] = (1.0 - RStack_28) * uv0[0] + RStack_28 * uv1[0];
                _ref_private_macro_code_rss_7 = ref_geom->face_seg_per_rad[ref_node._4_4_ * 0xf];
                temp_xyz[0] = ref_geom->face_seg_per_rad[ref_node._4_4_ * 0xf + 1];
                temp_xyz[1] = ref_geom->face_seg_per_rad[ref_node._4_4_ * 0xf + 2];
                RVar2 = ref_egads_invert((REF_GEOM)ref_cell,local_4c,local_50,
                                         (REF_DBL *)&ref_private_macro_code_rss_7,&local_1f8);
                if ((RVar2 == 0) &&
                   (uVar1 = ref_geom_add((REF_GEOM)ref_cell,ref_node._4_4_,local_4c,local_50,
                                         &local_1f8), uVar1 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x476,"ref_geom_add_between_face_interior",(ulong)uVar1,"new geom");
                  ref_grid_local._4_4_ = uVar1;
                }
                else {
                  actual = RStack_28;
                  last_error = 1.0;
                  relax = 0.0;
                  for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 10;
                      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                    uv0[1] = (1.0 - actual) * uv1[1] + actual * _ncell;
                    uVar1 = ref_geom_add((REF_GEOM)ref_cell,ref_node._4_4_,local_4c,local_50,uv0 + 1
                                        );
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x480,"ref_geom_add_between_face_interior",(ulong)uVar1,"new geom");
                      return uVar1;
                    }
                    uVar1 = ref_egads_eval_at((REF_GEOM)ref_cell,local_4c,local_50,uv0 + 1,
                                              ref_geom->face_seg_per_rad + ref_node._4_4_ * 0xf,
                                              (REF_DBL *)0x0);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x483,"ref_geom_add_between_face_interior",(ulong)uVar1,"eval");
                      return uVar1;
                    }
                    uVar1 = ref_node_ratio((REF_NODE)ref_geom,node1_weight_local._4_4_,
                                           ref_node._4_4_,&r1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x484,"ref_geom_add_between_face_interior",(ulong)uVar1,"get r0");
                      return uVar1;
                    }
                    uVar1 = ref_node_ratio((REF_NODE)ref_geom,node1_weight_local._0_4_,
                                           ref_node._4_4_,&weight);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x485,"ref_geom_add_between_face_interior",(ulong)uVar1,"get r1");
                      return uVar1;
                    }
                    if ((r1 + weight) * 1e+20 <= 0.0) {
                      local_238 = -((r1 + weight) * 1e+20);
                    }
                    else {
                      local_238 = (r1 + weight) * 1e+20;
                    }
                    if (r1 <= 0.0) {
                      local_248 = -r1;
                    }
                    else {
                      local_248 = r1;
                    }
                    if (local_238 <= local_248) break;
                    local_260 = r1 / (r1 + weight) - RStack_28;
                    if ((0 < ref_private_macro_code_rss_1) &&
                       (((local_260 < 0.0 && (0.0 < relax)) || ((0.0 < local_260 && (relax < 0.0))))
                       )) {
                      last_error = last_error * 0.5;
                    }
                    local_250 = local_260;
                    if (0.05 < local_260) {
                      local_250 = 0.05;
                    }
                    if (-0.05 <= local_250) {
                      if (0.05 < local_260) {
                        local_260 = 0.05;
                      }
                      local_258 = local_260;
                    }
                    else {
                      local_258 = -0.05;
                    }
                    relax = local_258;
                    local_278 = -last_error * local_258 + actual;
                    local_268 = local_278;
                    if (0.99 < local_278) {
                      local_268 = 0.99;
                    }
                    if (0.01 <= local_268) {
                      if (0.99 < local_278) {
                        local_278 = 0.99;
                      }
                      local_270 = local_278;
                    }
                    else {
                      local_270 = 0.01;
                    }
                    actual = local_270;
                    if (local_258 <= 0.0) {
                      local_280 = -local_258;
                    }
                    else {
                      local_280 = local_258;
                    }
                    if (local_280 < 0.005) break;
                  }
                  ref_grid_local._4_4_ = 0;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x46b,"ref_geom_add_between_face_interior",(ulong)uVar1,"cell uv1");
                ref_grid_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x469,"ref_geom_add_between_face_interior",(ulong)uVar1,"cell uv0");
              ref_grid_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x466,"ref_geom_add_between_face_interior",(ulong)uVar1,"cell nodes");
            ref_grid_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x465,"ref_geom_add_between_face_interior",(ulong)uVar1,"cell nodes");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x464,"ref_geom_add_between_face_interior","expected two tri for box2 nodes",2,
               (long)cells[0]);
        ref_grid_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x463,
             "ref_geom_add_between_face_interior",(ulong)uVar1,"list");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x461,
           "ref_geom_add_between_face_interior",(ulong)uVar1,"unique face id");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_add_between_face_interior(
    REF_GRID ref_grid, REF_INT node0, REF_INT node1, REF_DBL node1_weight,
    REF_INT new_node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT type, id;
  REF_DBL uv[2], uv0[2], uv1[2];
  REF_INT sense, ncell, cells[2];
  REF_INT nodes2[REF_CELL_MAX_SIZE_PER];
  REF_INT nodes3[REF_CELL_MAX_SIZE_PER];
  REF_DBL r0, r1;
  REF_DBL weight, actual, error, relax, last_error;
  REF_BOOL verbose = REF_FALSE;
  REF_INT i;

  type = REF_GEOM_FACE;
  RSS(ref_geom_unique_id(ref_geom, new_node, type, &id), "unique face id");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  REIS(2, ncell, "expected two tri for box2 nodes");
  RSS(ref_cell_nodes(ref_cell, cells[0], nodes2), "cell nodes");
  RSS(ref_cell_nodes(ref_cell, cells[1], nodes3), "cell nodes");

  RSS(ref_geom_cell_tuv(ref_geom, node0, nodes2, type, uv0, &sense),
      "cell uv0");
  RSS(ref_geom_cell_tuv(ref_geom, node1, nodes2, type, uv1, &sense),
      "cell uv1");

  {
    REF_DBL temp_uv[2], temp_xyz[3];
    temp_uv[0] = (1.0 - node1_weight) * uv0[0] + node1_weight * uv1[0];
    temp_uv[1] = (1.0 - node1_weight) * uv0[1] + node1_weight * uv1[1];
    temp_xyz[0] = ref_node_xyz(ref_node, 0, new_node);
    temp_xyz[1] = ref_node_xyz(ref_node, 1, new_node);
    temp_xyz[2] = ref_node_xyz(ref_node, 2, new_node);
    if (REF_SUCCESS ==
        ref_egads_invert(ref_geom, type, id, temp_xyz, temp_uv)) {
      RSS(ref_geom_add(ref_geom, new_node, type, id, temp_uv), "new geom");
    };
  }

  weight = node1_weight;
  relax = 1.0;
  error = 0.0;
  for (i = 0; i < 10; i++) {
    uv[0] = (1.0 - weight) * uv0[0] + weight * uv1[0];
    uv[1] = (1.0 - weight) * uv0[1] + weight * uv1[1];
    RSS(ref_geom_add(ref_geom, new_node, type, id, uv), "new geom");
    RSS(ref_egads_eval_at(ref_geom, type, id, uv,
                          ref_node_xyz_ptr(ref_node, new_node), NULL),
        "eval");
    RSS(ref_node_ratio(ref_node, node0, new_node, &r0), "get r0");
    RSS(ref_node_ratio(ref_node, node1, new_node, &r1), "get r1");
    if (!ref_math_divisible(r0, (r0 + r1))) break;
    actual = r0 / (r0 + r1);
    last_error = error;
    error = actual - node1_weight;
    if (i > 0 &&
        ((error < 0 && last_error > 0) || (error > 0 && last_error < 0)))
      relax *= 0.5;
    if (verbose)
      printf("target %f actual %f adjust %f errro %f\n", node1_weight, actual,
             weight, error);
    error = MAX(-0.05, MIN(0.05, error));
    weight = weight - relax * error;
    weight = MAX(0.01, MIN(0.99, weight));
    if (ABS(error) < 0.005) break;
  }

  return REF_SUCCESS;
}